

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgc2mgc.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  byte bVar2;
  ostream *poVar3;
  Buffer *buffer_00;
  vector<double,_std::allocator<double>_> *sequence_to_read;
  reference pdVar4;
  long in_RSI;
  int in_EDI;
  double dVar5;
  ostringstream error_message_14;
  ostringstream error_message_13;
  vector<double,_std::allocator<double>_> transformed_mel_generalized_cepstrum;
  vector<double,_std::allocator<double>_> mel_generalized_cepstrum;
  int output_length;
  int input_length;
  ostringstream error_message_12;
  Buffer buffer;
  MelGeneralizedCepstrumToMelGeneralizedCepstrum mel_generalized_cepstrum_transform;
  istream *input_stream;
  ostringstream error_message_11;
  ifstream ifs;
  ostringstream error_message_10;
  char *input_file;
  ostringstream error_message_9;
  int num_input_files;
  ostringstream error_message_8;
  ostringstream error_message_7;
  int tmp_1;
  ostringstream error_message_6;
  ostringstream error_message_5;
  ostringstream error_message_4;
  ostringstream error_message_3;
  int tmp;
  ostringstream error_message_2;
  ostringstream error_message_1;
  ostringstream error_message;
  int option_char;
  bool output_multiplication_flag;
  bool output_normalization_flag;
  double output_gamma;
  double output_alpha;
  int output_num_order;
  bool input_multiplication_flag;
  bool input_normalization_flag;
  double input_gamma;
  double input_alpha;
  int input_num_order;
  option *in_stack_ffffffffffffe098;
  vector<double,_std::allocator<double>_> *this;
  Buffer *in_stack_ffffffffffffe0a0;
  string *in_stack_ffffffffffffe0a8;
  allocator *paVar6;
  undefined4 in_stack_ffffffffffffe0b0;
  int in_stack_ffffffffffffe0b4;
  size_type in_stack_ffffffffffffe0b8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffe0c0;
  int *in_stack_ffffffffffffe0d0;
  undefined7 in_stack_ffffffffffffe0d8;
  undefined1 in_stack_ffffffffffffe0df;
  undefined1 *puVar7;
  vector<double,_std::allocator<double>_> *output;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffe100;
  MelGeneralizedCepstrumToMelGeneralizedCepstrum *in_stack_ffffffffffffe108;
  char *local_1ee8;
  ostream *in_stack_ffffffffffffe140;
  char *pcVar8;
  char *local_1ea0;
  bool local_1e62;
  byte local_1e3a;
  byte local_1e12;
  bool local_1de2;
  bool local_1dba;
  undefined8 in_stack_ffffffffffffe258;
  undefined2 uVar9;
  double in_stack_ffffffffffffe260;
  ostringstream *poVar10;
  undefined4 in_stack_ffffffffffffe268;
  byte in_stack_ffffffffffffe26c;
  undefined1 in_stack_ffffffffffffe26d;
  byte in_stack_ffffffffffffe26e;
  undefined1 in_stack_ffffffffffffe26f;
  char *in_stack_ffffffffffffe270;
  allocator *in_stack_ffffffffffffe278;
  double in_stack_ffffffffffffe280;
  ostringstream *in_stack_ffffffffffffe288;
  undefined4 in_stack_ffffffffffffe290;
  byte in_stack_ffffffffffffe294;
  undefined1 in_stack_ffffffffffffe295;
  byte in_stack_ffffffffffffe296;
  undefined1 in_stack_ffffffffffffe297;
  bool local_1d3a;
  allocator local_1d19;
  string local_1d18 [32];
  ostringstream local_1cf8 [376];
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_1b80;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_1b78;
  allocator local_1b69;
  string local_1b68 [32];
  ostringstream local_1b48 [376];
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_19d0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_19c8;
  undefined1 local_19b9 [32];
  vector<double,_std::allocator<double>_> local_1999;
  int local_197c;
  int local_1978;
  allocator local_1971;
  string local_1970 [32];
  ostringstream local_1950 [440];
  MelGeneralizedCepstrumToMelGeneralizedCepstrum local_1798;
  char *local_1730;
  undefined4 local_1728;
  allocator local_1721;
  string local_1720 [32];
  ostringstream local_1700 [376];
  char local_1588 [527];
  allocator local_1379;
  string local_1378 [32];
  ostringstream local_1358 [376];
  char *local_11e0;
  allocator local_11d1;
  string local_11d0 [32];
  ostringstream local_11b0 [376];
  int local_1038;
  allocator local_1031;
  string local_1030 [32];
  ostringstream local_1010 [383];
  allocator local_e91;
  string local_e90 [32];
  ostringstream local_e70 [383];
  allocator local_cf1;
  string local_cf0 [32];
  int local_cd0;
  allocator local_cc9;
  string local_cc8 [32];
  ostringstream local_ca8 [383];
  allocator local_b29;
  string local_b28 [39];
  allocator local_b01;
  string local_b00 [32];
  ostringstream local_ae0 [383];
  allocator local_961;
  string local_960 [39];
  allocator local_939;
  string local_938 [32];
  ostringstream local_918 [383];
  allocator local_799;
  string local_798 [39];
  allocator local_771;
  string local_770 [32];
  ostringstream local_750 [383];
  allocator local_5d1;
  string local_5d0 [32];
  int local_5b0;
  allocator local_5a9;
  string local_5a8 [32];
  ostringstream local_588 [383];
  allocator local_409;
  string local_408 [39];
  allocator local_3e1;
  string local_3e0 [32];
  ostringstream local_3c0 [383];
  allocator local_241;
  string local_240 [39];
  allocator local_219;
  string local_218 [32];
  ostringstream local_1f8 [399];
  allocator local_69;
  string local_68 [32];
  int local_48;
  byte local_42;
  byte local_41;
  double local_40;
  double local_38;
  int local_30;
  byte local_2a;
  byte local_29;
  double local_28;
  double local_20;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = 0x19;
  local_20 = 0.0;
  local_28 = 0.0;
  local_29 = 0;
  local_2a = 0;
  local_30 = 0x19;
  local_38 = 0.0;
  local_40 = 1.0;
  local_41 = 0;
  local_42 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while( true ) {
    local_48 = ya_getopt_long(in_stack_ffffffffffffe0b4,(char **)in_stack_ffffffffffffe0a8,
                              (char *)in_stack_ffffffffffffe0a0,in_stack_ffffffffffffe098,
                              (int *)0x10383f);
    pcVar8 = ya_optarg;
    uVar9 = (undefined2)((ulong)in_stack_ffffffffffffe258 >> 0x30);
    if (local_48 == -1) break;
    switch(local_48) {
    case 0x41:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_960,pcVar8,&local_961);
      bVar1 = sptk::ConvertStringToDouble
                        (in_stack_ffffffffffffe0a8,(double *)in_stack_ffffffffffffe0a0);
      local_1e12 = 1;
      if (bVar1) {
        bVar1 = sptk::IsValidAlpha(local_38);
        local_1e12 = bVar1 ^ 0xff;
      }
      std::__cxx11::string::~string(local_960);
      std::allocator<char>::~allocator((allocator<char> *)&local_961);
      if ((local_1e12 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_ae0);
        std::operator<<((ostream *)local_ae0,"The argument for the -A option must be in (-1.0, 1.0)"
                       );
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_b00,"mgc2mgc",&local_b01);
        sptk::PrintErrorMessage
                  ((string *)
                   CONCAT17(in_stack_ffffffffffffe297,
                            CONCAT16(in_stack_ffffffffffffe296,
                                     CONCAT15(in_stack_ffffffffffffe295,
                                              CONCAT14(in_stack_ffffffffffffe294,
                                                       in_stack_ffffffffffffe290)))),
                   in_stack_ffffffffffffe288);
        std::__cxx11::string::~string(local_b00);
        std::allocator<char>::~allocator((allocator<char> *)&local_b01);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_ae0);
        return local_4;
      }
      break;
    default:
      anon_unknown.dwarf_1996::PrintUsage(in_stack_ffffffffffffe140);
      return 1;
    case 0x43:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_cf0,pcVar8,&local_cf1);
      bVar1 = sptk::ConvertStringToInteger
                        (in_stack_ffffffffffffe0a8,(int *)in_stack_ffffffffffffe0a0);
      local_1e62 = !bVar1 || local_cd0 < 1;
      std::__cxx11::string::~string(local_cf0);
      std::allocator<char>::~allocator((allocator<char> *)&local_cf1);
      if (local_1e62) {
        std::__cxx11::ostringstream::ostringstream(local_e70);
        std::operator<<((ostream *)local_e70,
                        "The argument for the -C option must be a positive integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_e90,"mgc2mgc",&local_e91);
        sptk::PrintErrorMessage
                  ((string *)
                   CONCAT17(in_stack_ffffffffffffe297,
                            CONCAT16(in_stack_ffffffffffffe296,
                                     CONCAT15(in_stack_ffffffffffffe295,
                                              CONCAT14(in_stack_ffffffffffffe294,
                                                       in_stack_ffffffffffffe290)))),
                   in_stack_ffffffffffffe288);
        std::__cxx11::string::~string(local_e90);
        std::allocator<char>::~allocator((allocator<char> *)&local_e91);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_e70);
        return local_4;
      }
      local_40 = -1.0 / (double)local_cd0;
      break;
    case 0x47:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b28,pcVar8,&local_b29);
      bVar1 = sptk::ConvertStringToDouble
                        (in_stack_ffffffffffffe0a8,(double *)in_stack_ffffffffffffe0a0);
      local_1e3a = 1;
      if (bVar1) {
        bVar1 = sptk::IsValidGamma(local_40);
        local_1e3a = bVar1 ^ 0xff;
      }
      std::__cxx11::string::~string(local_b28);
      std::allocator<char>::~allocator((allocator<char> *)&local_b29);
      if ((local_1e3a & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_ca8);
        std::operator<<((ostream *)local_ca8,"The argument for the -G option must be in [-1.0, 1.0]"
                       );
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_cc8,"mgc2mgc",&local_cc9);
        sptk::PrintErrorMessage
                  ((string *)
                   CONCAT17(in_stack_ffffffffffffe297,
                            CONCAT16(in_stack_ffffffffffffe296,
                                     CONCAT15(in_stack_ffffffffffffe295,
                                              CONCAT14(in_stack_ffffffffffffe294,
                                                       in_stack_ffffffffffffe290)))),
                   in_stack_ffffffffffffe288);
        std::__cxx11::string::~string(local_cc8);
        std::allocator<char>::~allocator((allocator<char> *)&local_cc9);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_ca8);
        return local_4;
      }
      break;
    case 0x4d:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_798,pcVar8,&local_799);
      bVar1 = sptk::ConvertStringToInteger
                        (in_stack_ffffffffffffe0a8,(int *)in_stack_ffffffffffffe0a0);
      local_1de2 = !bVar1 || local_30 < 0;
      std::__cxx11::string::~string(local_798);
      std::allocator<char>::~allocator((allocator<char> *)&local_799);
      if (local_1de2) {
        std::__cxx11::ostringstream::ostringstream(local_918);
        poVar3 = std::operator<<((ostream *)local_918,"The argument for the -M option must be a ");
        std::operator<<(poVar3,"non-negative integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_938,"mgc2mgc",&local_939);
        sptk::PrintErrorMessage
                  ((string *)
                   CONCAT17(in_stack_ffffffffffffe297,
                            CONCAT16(in_stack_ffffffffffffe296,
                                     CONCAT15(in_stack_ffffffffffffe295,
                                              CONCAT14(in_stack_ffffffffffffe294,
                                                       in_stack_ffffffffffffe290)))),
                   in_stack_ffffffffffffe288);
        std::__cxx11::string::~string(local_938);
        std::allocator<char>::~allocator((allocator<char> *)&local_939);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_918);
        return local_4;
      }
      break;
    case 0x4e:
      local_41 = 1;
      break;
    case 0x55:
      local_42 = 1;
      break;
    case 0x61:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_240,pcVar8,&local_241);
      in_stack_ffffffffffffe297 =
           sptk::ConvertStringToDouble
                     (in_stack_ffffffffffffe0a8,(double *)in_stack_ffffffffffffe0a0);
      in_stack_ffffffffffffe294 = 1;
      if ((bool)in_stack_ffffffffffffe297) {
        in_stack_ffffffffffffe295 = sptk::IsValidAlpha(local_20);
        in_stack_ffffffffffffe294 = in_stack_ffffffffffffe295 ^ 0xff;
      }
      in_stack_ffffffffffffe296 = in_stack_ffffffffffffe294;
      std::__cxx11::string::~string(local_240);
      std::allocator<char>::~allocator((allocator<char> *)&local_241);
      if ((in_stack_ffffffffffffe294 & 1) != 0) {
        poVar10 = local_3c0;
        std::__cxx11::ostringstream::ostringstream(poVar10);
        std::operator<<((ostream *)poVar10,"The argument for the -a option must be in (-1.0, 1.0)");
        paVar6 = &local_3e1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3e0,"mgc2mgc",paVar6);
        sptk::PrintErrorMessage
                  ((string *)
                   CONCAT17(in_stack_ffffffffffffe297,
                            CONCAT16(in_stack_ffffffffffffe296,
                                     CONCAT15(in_stack_ffffffffffffe295,
                                              CONCAT14(in_stack_ffffffffffffe294,
                                                       in_stack_ffffffffffffe290)))),
                   (ostringstream *)poVar10);
        std::__cxx11::string::~string(local_3e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_3c0);
        return local_4;
      }
      break;
    case 99:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5d0,pcVar8,&local_5d1);
      bVar1 = sptk::ConvertStringToInteger
                        (in_stack_ffffffffffffe0a8,(int *)in_stack_ffffffffffffe0a0);
      local_1dba = !bVar1 || local_5b0 < 1;
      std::__cxx11::string::~string(local_5d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
      if (local_1dba) {
        std::__cxx11::ostringstream::ostringstream(local_750);
        std::operator<<((ostream *)local_750,
                        "The argument for the -c option must be a positive integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_770,"mgc2mgc",&local_771);
        sptk::PrintErrorMessage
                  ((string *)
                   CONCAT17(in_stack_ffffffffffffe297,
                            CONCAT16(in_stack_ffffffffffffe296,
                                     CONCAT15(in_stack_ffffffffffffe295,
                                              CONCAT14(in_stack_ffffffffffffe294,
                                                       in_stack_ffffffffffffe290)))),
                   in_stack_ffffffffffffe288);
        std::__cxx11::string::~string(local_770);
        std::allocator<char>::~allocator((allocator<char> *)&local_771);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_750);
        return local_4;
      }
      local_28 = -1.0 / (double)local_5b0;
      break;
    case 0x67:
      in_stack_ffffffffffffe278 = &local_409;
      in_stack_ffffffffffffe270 = ya_optarg;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_408,in_stack_ffffffffffffe270,in_stack_ffffffffffffe278);
      in_stack_ffffffffffffe26f =
           sptk::ConvertStringToDouble
                     (in_stack_ffffffffffffe0a8,(double *)in_stack_ffffffffffffe0a0);
      in_stack_ffffffffffffe26c = 1;
      if ((bool)in_stack_ffffffffffffe26f) {
        in_stack_ffffffffffffe26d = sptk::IsValidGamma(local_28);
        in_stack_ffffffffffffe26c = in_stack_ffffffffffffe26d ^ 0xff;
      }
      in_stack_ffffffffffffe26e = in_stack_ffffffffffffe26c;
      std::__cxx11::string::~string(local_408);
      std::allocator<char>::~allocator((allocator<char> *)&local_409);
      if ((in_stack_ffffffffffffe26c & 1) != 0) {
        poVar10 = local_588;
        std::__cxx11::ostringstream::ostringstream(poVar10);
        std::operator<<((ostream *)poVar10,"The argument for the -g option must be in [-1.0, 1.0]");
        paVar6 = &local_5a9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_5a8,"mgc2mgc",paVar6);
        sptk::PrintErrorMessage
                  ((string *)
                   CONCAT17(in_stack_ffffffffffffe297,
                            CONCAT16(in_stack_ffffffffffffe296,
                                     CONCAT15(in_stack_ffffffffffffe295,
                                              CONCAT14(in_stack_ffffffffffffe294,
                                                       in_stack_ffffffffffffe290)))),
                   in_stack_ffffffffffffe288);
        std::__cxx11::string::~string(local_5a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_588);
        return local_4;
      }
      break;
    case 0x68:
      anon_unknown.dwarf_1996::PrintUsage(in_stack_ffffffffffffe140);
      return 0;
    case 0x6d:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_68,pcVar8,&local_69);
      bVar1 = sptk::ConvertStringToInteger
                        (in_stack_ffffffffffffe0a8,(int *)in_stack_ffffffffffffe0a0);
      local_1d3a = !bVar1 || local_14 < 0;
      std::__cxx11::string::~string(local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
      if (local_1d3a) {
        std::__cxx11::ostringstream::ostringstream(local_1f8);
        poVar3 = std::operator<<((ostream *)local_1f8,"The argument for the -m option must be a ");
        std::operator<<(poVar3,"non-negative integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_218,"mgc2mgc",&local_219);
        sptk::PrintErrorMessage
                  ((string *)
                   CONCAT17(in_stack_ffffffffffffe297,
                            CONCAT16(in_stack_ffffffffffffe296,
                                     CONCAT15(in_stack_ffffffffffffe295,
                                              CONCAT14(in_stack_ffffffffffffe294,
                                                       in_stack_ffffffffffffe290)))),
                   in_stack_ffffffffffffe288);
        std::__cxx11::string::~string(local_218);
        std::allocator<char>::~allocator((allocator<char> *)&local_219);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1f8);
        return local_4;
      }
      break;
    case 0x6e:
      local_29 = 1;
      break;
    case 0x75:
      local_2a = 1;
    }
  }
  if (((local_28 == 0.0) && (!NAN(local_28))) && ((local_2a & 1) != 0)) {
    std::__cxx11::ostringstream::ostringstream(local_1010);
    std::operator<<((ostream *)local_1010,"If -u option is given, input gamma must not be 0");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1030,"mgc2mgc",&local_1031);
    sptk::PrintErrorMessage
              ((string *)
               CONCAT17(in_stack_ffffffffffffe297,
                        CONCAT16(in_stack_ffffffffffffe296,
                                 CONCAT15(in_stack_ffffffffffffe295,
                                          CONCAT14(in_stack_ffffffffffffe294,
                                                   in_stack_ffffffffffffe290)))),
               in_stack_ffffffffffffe288);
    std::__cxx11::string::~string(local_1030);
    std::allocator<char>::~allocator((allocator<char> *)&local_1031);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1010);
    return local_4;
  }
  local_1038 = local_8 - ya_optind;
  if (1 < local_1038) {
    std::__cxx11::ostringstream::ostringstream(local_11b0);
    std::operator<<((ostream *)local_11b0,"Too many input files");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_11d0,"mgc2mgc",&local_11d1);
    sptk::PrintErrorMessage
              ((string *)
               CONCAT17(in_stack_ffffffffffffe297,
                        CONCAT16(in_stack_ffffffffffffe296,
                                 CONCAT15(in_stack_ffffffffffffe295,
                                          CONCAT14(in_stack_ffffffffffffe294,
                                                   in_stack_ffffffffffffe290)))),
               in_stack_ffffffffffffe288);
    std::__cxx11::string::~string(local_11d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_11d1);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_11b0);
    return local_4;
  }
  if (local_1038 == 0) {
    local_1ea0 = (char *)0x0;
  }
  else {
    local_1ea0 = *(char **)(local_10 + (long)ya_optind * 8);
  }
  local_11e0 = local_1ea0;
  bVar1 = sptk::SetBinaryMode();
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1358);
    std::operator<<((ostream *)local_1358,"Cannot set translation mode");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1378,"mgc2mgc",&local_1379);
    sptk::PrintErrorMessage
              ((string *)
               CONCAT17(in_stack_ffffffffffffe297,
                        CONCAT16(in_stack_ffffffffffffe296,
                                 CONCAT15(in_stack_ffffffffffffe295,
                                          CONCAT14(in_stack_ffffffffffffe294,
                                                   in_stack_ffffffffffffe290)))),
               in_stack_ffffffffffffe288);
    std::__cxx11::string::~string(local_1378);
    std::allocator<char>::~allocator((allocator<char> *)&local_1379);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1358);
    return local_4;
  }
  std::ifstream::ifstream(local_1588);
  if (local_11e0 != (char *)0x0) {
    pcVar8 = local_11e0;
    std::operator|(_S_in,_S_bin);
    std::ifstream::open(local_1588,(_Ios_Openmode)pcVar8);
    bVar2 = std::ios::fail();
    if ((bVar2 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_1700);
      poVar3 = std::operator<<((ostream *)local_1700,"Cannot open file ");
      std::operator<<(poVar3,local_11e0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1720,"mgc2mgc",&local_1721);
      sptk::PrintErrorMessage
                ((string *)
                 CONCAT17(in_stack_ffffffffffffe297,
                          CONCAT16(in_stack_ffffffffffffe296,
                                   CONCAT15(in_stack_ffffffffffffe295,
                                            CONCAT14(in_stack_ffffffffffffe294,
                                                     in_stack_ffffffffffffe290)))),
                 in_stack_ffffffffffffe288);
      std::__cxx11::string::~string(local_1720);
      std::allocator<char>::~allocator((allocator<char> *)&local_1721);
      local_4 = 1;
      local_1728 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_1700);
      goto LAB_001058cc;
    }
  }
  bVar2 = std::ifstream::is_open();
  if ((bVar2 & 1) == 0) {
    local_1ee8 = (char *)&std::cin;
  }
  else {
    local_1ee8 = local_1588;
  }
  local_1730 = local_1ee8;
  sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::
  MelGeneralizedCepstrumToMelGeneralizedCepstrum
            ((MelGeneralizedCepstrumToMelGeneralizedCepstrum *)
             CONCAT17(in_stack_ffffffffffffe297,
                      CONCAT16(in_stack_ffffffffffffe296,
                               CONCAT15(in_stack_ffffffffffffe295,
                                        CONCAT14(in_stack_ffffffffffffe294,in_stack_ffffffffffffe290
                                                )))),(int)((ulong)in_stack_ffffffffffffe288 >> 0x20)
             ,in_stack_ffffffffffffe280,(double)in_stack_ffffffffffffe278,
             SUB81((ulong)in_stack_ffffffffffffe270 >> 0x38,0),
             SUB81((ulong)in_stack_ffffffffffffe270 >> 0x30,0),(int)in_stack_ffffffffffffe270,
             (double)CONCAT17(in_stack_ffffffffffffe26f,
                              CONCAT16(in_stack_ffffffffffffe26e,
                                       CONCAT15(in_stack_ffffffffffffe26d,
                                                CONCAT14(in_stack_ffffffffffffe26c,
                                                         in_stack_ffffffffffffe268)))),
             in_stack_ffffffffffffe260,SUB21((ushort)uVar9 >> 8,0),SUB21(uVar9,0));
  sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::Buffer::Buffer(in_stack_ffffffffffffe0a0);
  bVar1 = sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::IsValid(&local_1798);
  if (bVar1) {
    local_1978 = local_14 + 1;
    local_197c = local_30 + 1;
    buffer_00 = (Buffer *)(long)local_1978;
    output = &local_1999;
    std::allocator<double>::allocator((allocator<double> *)0x10538a);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               (allocator_type *)CONCAT44(in_stack_ffffffffffffe0b4,in_stack_ffffffffffffe0b0));
    std::allocator<double>::~allocator((allocator<double> *)0x1053b0);
    sequence_to_read = (vector<double,_std::allocator<double>_> *)(long)local_197c;
    puVar7 = local_19b9;
    std::allocator<double>::allocator((allocator<double> *)0x1053cf);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               (allocator_type *)CONCAT44(in_stack_ffffffffffffe0b4,in_stack_ffffffffffffe0b0));
    std::allocator<double>::~allocator((allocator<double> *)0x1053f5);
    do {
      this = (vector<double,_std::allocator<double>_> *)0x0;
      in_stack_ffffffffffffe0df =
           sptk::ReadStream<double>
                     (SUB81((ulong)buffer_00 >> 0x30,0),(int)buffer_00,(int)((ulong)puVar7 >> 0x20),
                      (int)puVar7,sequence_to_read,
                      (istream *)CONCAT17(in_stack_ffffffffffffe0df,in_stack_ffffffffffffe0d8),
                      (int *)in_stack_ffffffffffffe100);
      if (!(bool)in_stack_ffffffffffffe0df) {
        local_4 = 0;
        local_1728 = 1;
        goto LAB_0010585c;
      }
      if (((local_29 & 1) == 0) && ((local_2a & 1) != 0)) {
        local_19c8._M_current = (double *)std::vector<double,_std::allocator<double>_>::begin(this);
        pdVar4 = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator*(&local_19c8);
        in_stack_ffffffffffffe0d0 = (int *)((*pdVar4 - 1.0) / local_28);
        local_19d0._M_current = (double *)std::vector<double,_std::allocator<double>_>::begin(this);
        pdVar4 = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator*(&local_19d0);
        *pdVar4 = (double)in_stack_ffffffffffffe0d0;
      }
      bVar1 = sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::Run
                        (in_stack_ffffffffffffe108,in_stack_ffffffffffffe100,output,buffer_00);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream(local_1b48);
        std::operator<<((ostream *)local_1b48,
                        "Failed to run mel-generalized cepstral transformation");
        paVar6 = &local_1b69;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1b68,"mgc2mgc",paVar6);
        sptk::PrintErrorMessage
                  ((string *)
                   CONCAT17(in_stack_ffffffffffffe297,
                            CONCAT16(in_stack_ffffffffffffe296,
                                     CONCAT15(in_stack_ffffffffffffe295,
                                              CONCAT14(in_stack_ffffffffffffe294,
                                                       in_stack_ffffffffffffe290)))),
                   in_stack_ffffffffffffe288);
        std::__cxx11::string::~string(local_1b68);
        std::allocator<char>::~allocator((allocator<char> *)&local_1b69);
        local_4 = 1;
        local_1728 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1b48);
        goto LAB_0010585c;
      }
      if (((local_41 & 1) == 0) && ((local_42 & 1) != 0)) {
        local_1b78._M_current = (double *)std::vector<double,_std::allocator<double>_>::begin(this);
        pdVar4 = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator*(&local_1b78);
        dVar5 = *pdVar4 * local_40 + 1.0;
        local_1b80._M_current = (double *)std::vector<double,_std::allocator<double>_>::begin(this);
        pdVar4 = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator*(&local_1b80);
        *pdVar4 = dVar5;
      }
      bVar1 = sptk::WriteStream<double>
                        ((int)buffer_00,(int)((ulong)puVar7 >> 0x20),sequence_to_read,
                         (ostream *)CONCAT17(in_stack_ffffffffffffe0df,in_stack_ffffffffffffe0d8),
                         in_stack_ffffffffffffe0d0);
      in_stack_ffffffffffffe0b4 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffe0b4);
    } while (bVar1);
    std::__cxx11::ostringstream::ostringstream(local_1cf8);
    std::operator<<((ostream *)local_1cf8,"Failed to write mel-generalized cepstrum");
    paVar6 = &local_1d19;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d18,"mgc2mgc",paVar6);
    sptk::PrintErrorMessage
              ((string *)
               CONCAT17(in_stack_ffffffffffffe297,
                        CONCAT16(in_stack_ffffffffffffe296,
                                 CONCAT15(in_stack_ffffffffffffe295,
                                          CONCAT14(in_stack_ffffffffffffe294,
                                                   in_stack_ffffffffffffe290)))),
               in_stack_ffffffffffffe288);
    std::__cxx11::string::~string(local_1d18);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d19);
    local_4 = 1;
    local_1728 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1cf8);
LAB_0010585c:
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffe0b4,in_stack_ffffffffffffe0b0));
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffe0b4,in_stack_ffffffffffffe0b0));
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1950);
    poVar3 = std::operator<<((ostream *)local_1950,"Failed to initialize ");
    std::operator<<(poVar3,"MelGeneralizedCepstrumToMelGeneralizedCepstrum");
    paVar6 = &local_1971;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1970,"mgc2mgc",paVar6);
    sptk::PrintErrorMessage
              ((string *)
               CONCAT17(in_stack_ffffffffffffe297,
                        CONCAT16(in_stack_ffffffffffffe296,
                                 CONCAT15(in_stack_ffffffffffffe295,
                                          CONCAT14(in_stack_ffffffffffffe294,
                                                   in_stack_ffffffffffffe290)))),
               in_stack_ffffffffffffe288);
    std::__cxx11::string::~string(local_1970);
    std::allocator<char>::~allocator((allocator<char> *)&local_1971);
    local_4 = 1;
    local_1728 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1950);
  }
  sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::Buffer::~Buffer(in_stack_ffffffffffffe0a0);
  sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::
  ~MelGeneralizedCepstrumToMelGeneralizedCepstrum
            ((MelGeneralizedCepstrumToMelGeneralizedCepstrum *)
             CONCAT44(in_stack_ffffffffffffe0b4,in_stack_ffffffffffffe0b0));
LAB_001058cc:
  std::ifstream::~ifstream(local_1588);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  int input_num_order(kDefaultInputNumOrder);
  double input_alpha(kDefaultInputAlpha);
  double input_gamma(kDefaultInputGamma);
  bool input_normalization_flag(kDefaultInputNormalizationFlag);
  bool input_multiplication_flag(kDefaultInputMultiplicationFlag);
  int output_num_order(kDefaultOutputNumOrder);
  double output_alpha(kDefaultOutputAlpha);
  double output_gamma(kDefaultOutputGamma);
  bool output_normalization_flag(kDefaultOutputNormalizationFlag);
  bool output_multiplication_flag(kDefaultOutputMultiplicationFlag);

  for (;;) {
    const int option_char(
        getopt_long(argc, argv, "m:a:g:c:nuM:A:G:C:NUh", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &input_num_order) ||
            input_num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("mgc2mgc", error_message);
          return 1;
        }
        break;
      }
      case 'a': {
        if (!sptk::ConvertStringToDouble(optarg, &input_alpha) ||
            !sptk::IsValidAlpha(input_alpha)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -a option must be in (-1.0, 1.0)";
          sptk::PrintErrorMessage("mgc2mgc", error_message);
          return 1;
        }
        break;
      }
      case 'g': {
        if (!sptk::ConvertStringToDouble(optarg, &input_gamma) ||
            !sptk::IsValidGamma(input_gamma)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -g option must be in [-1.0, 1.0]";
          sptk::PrintErrorMessage("mgc2mgc", error_message);
          return 1;
        }
        break;
      }
      case 'c': {
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) || tmp < 1) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -c option must be a positive integer";
          sptk::PrintErrorMessage("mgc2mgc", error_message);
          return 1;
        }
        input_gamma = -1.0 / tmp;
        break;
      }
      case 'n': {
        input_normalization_flag = true;
        break;
      }
      case 'u': {
        input_multiplication_flag = true;
        break;
      }
      case 'M': {
        if (!sptk::ConvertStringToInteger(optarg, &output_num_order) ||
            output_num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -M option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("mgc2mgc", error_message);
          return 1;
        }
        break;
      }
      case 'A': {
        if (!sptk::ConvertStringToDouble(optarg, &output_alpha) ||
            !sptk::IsValidAlpha(output_alpha)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -A option must be in (-1.0, 1.0)";
          sptk::PrintErrorMessage("mgc2mgc", error_message);
          return 1;
        }
        break;
      }
      case 'G': {
        if (!sptk::ConvertStringToDouble(optarg, &output_gamma) ||
            !sptk::IsValidGamma(output_gamma)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -G option must be in [-1.0, 1.0]";
          sptk::PrintErrorMessage("mgc2mgc", error_message);
          return 1;
        }
        break;
      }
      case 'C': {
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) || tmp < 1) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -C option must be a positive integer";
          sptk::PrintErrorMessage("mgc2mgc", error_message);
          return 1;
        }
        output_gamma = -1.0 / tmp;
        break;
      }
      case 'N': {
        output_normalization_flag = true;
        break;
      }
      case 'U': {
        output_multiplication_flag = true;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (0.0 == input_gamma && input_multiplication_flag) {
    std::ostringstream error_message;
    error_message << "If -u option is given, input gamma must not be 0";
    sptk::PrintErrorMessage("mgc2mgc", error_message);
    return 1;
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("mgc2mgc", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("mgc2mgc", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("mgc2mgc", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum
      mel_generalized_cepstrum_transform(
          input_num_order, input_alpha, input_gamma, input_normalization_flag,
          input_multiplication_flag, output_num_order, output_alpha,
          output_gamma, output_normalization_flag, output_multiplication_flag);
  sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::Buffer buffer;
  if (!mel_generalized_cepstrum_transform.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize "
                  << "MelGeneralizedCepstrumToMelGeneralizedCepstrum";
    sptk::PrintErrorMessage("mgc2mgc", error_message);
    return 1;
  }

  const int input_length(input_num_order + 1);
  const int output_length(output_num_order + 1);
  std::vector<double> mel_generalized_cepstrum(input_length);
  std::vector<double> transformed_mel_generalized_cepstrum(output_length);

  while (sptk::ReadStream(false, 0, 0, input_length, &mel_generalized_cepstrum,
                          &input_stream, NULL)) {
    // Perform input modification: 1+g*mgc[0] -> mgc[0]
    if (!input_normalization_flag && input_multiplication_flag)
      (*mel_generalized_cepstrum.begin()) =
          (*(mel_generalized_cepstrum.begin()) - 1.0) / input_gamma;

    // Transform.
    if (!mel_generalized_cepstrum_transform.Run(
            mel_generalized_cepstrum, &transformed_mel_generalized_cepstrum,
            &buffer)) {
      std::ostringstream error_message;
      error_message << "Failed to run mel-generalized cepstral transformation";
      sptk::PrintErrorMessage("mgc2mgc", error_message);
      return 1;
    }

    // Perform output modification: mgc[0] -> 1+g*mgc[0]
    if (!output_normalization_flag && output_multiplication_flag)
      (*transformed_mel_generalized_cepstrum.begin()) =
          *(transformed_mel_generalized_cepstrum.begin()) * output_gamma + 1.0;

    // Write results.
    if (!sptk::WriteStream(0, output_length,
                           transformed_mel_generalized_cepstrum, &std::cout,
                           NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write mel-generalized cepstrum";
      sptk::PrintErrorMessage("mgc2mgc", error_message);
      return 1;
    }
  }

  return 0;
}